

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
aeron::archive::util::PropertiesReader::parse_value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,PropertiesReader *this,string *v,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2_local;
  string *v_local;
  PropertiesReader *this_local;
  
  boost::lexical_cast<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(boost *)v,v);
  return __return_storage_ptr__;
}

Assistant:

T parse_value(const std::string& v, T*) {
        return boost::lexical_cast<T>(v);
    }